

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O2

FaceHandle __thiscall OpenMesh::PolyConnectivity::remove_edge(PolyConnectivity *this,EdgeHandle _eh)

{
  bool bVar1;
  FaceHandle FVar2;
  HalfedgeHandle _heh;
  HalfedgeHandle _nheh;
  HalfedgeHandle _nheh_00;
  VertexHandle _vh;
  VertexHandle _vh_00;
  HalfedgeHandle HVar3;
  BaseHandle BVar4;
  HalfedgeHandle HVar5;
  value_type _heh_00;
  StatusInfo *pSVar6;
  Vertex *pVVar7;
  Face *pFVar8;
  Halfedge *pHVar9;
  BaseHandle _fh;
  BaseHandle _heh_01;
  undefined1 local_70 [8];
  FaceHalfedgeIter fh_it;
  BaseHandle local_38;
  BaseHandle local_34;
  
  pSVar6 = ArrayKernel::status(&this->super_ArrayKernel,_eh);
  if (((pSVar6->status_ & 1) == 0) && (bVar1 = is_simple_link(this,_eh), bVar1)) {
    HVar5.super_BaseHandle.idx_ = (BaseHandle)((int)_eh.super_BaseHandle.idx_ * 2);
    _heh_01.idx_ = (int)_eh.super_BaseHandle.idx_ * 2 + 1;
    FVar2 = ArrayKernel::face_handle(&this->super_ArrayKernel,HVar5);
    local_38.idx_ = (int)ArrayKernel::face_handle(&this->super_ArrayKernel,_heh_01.idx_);
    _fh = FVar2.super_BaseHandle.idx_;
    fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_ =
         (ulong)(uint)_eh.super_BaseHandle.idx_;
    if (local_38.idx_ == -1) {
      if (FVar2.super_BaseHandle.idx_ == -1) {
        __assert_fail("del_fh.is_valid()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                      ,0x36d,
                      "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::remove_edge(EdgeHandle)"
                     );
      }
      _fh.idx_ = -1;
      local_38 = FVar2.super_BaseHandle.idx_;
    }
    _heh = ArrayKernel::prev_halfedge_handle(&this->super_ArrayKernel,HVar5.super_BaseHandle.idx_);
    local_34.idx_ = (int)ArrayKernel::prev_halfedge_handle(&this->super_ArrayKernel,_heh_01.idx_);
    _nheh = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,HVar5);
    _nheh_00 = ArrayKernel::next_halfedge_handle
                         (&this->super_ArrayKernel,(HalfedgeHandle)_heh_01.idx_);
    ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_heh,_nheh_00);
    ArrayKernel::set_next_halfedge_handle
              (&this->super_ArrayKernel,(HalfedgeHandle)local_34.idx_,_nheh);
    _vh = ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,HVar5);
    _vh_00 = ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,(HalfedgeHandle)_heh_01.idx_);
    HVar3 = ArrayKernel::halfedge_handle(&this->super_ArrayKernel,_vh);
    if (HVar3.super_BaseHandle.idx_ == (BaseHandle)_heh_01.idx_) {
      pVVar7 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh);
      (pVVar7->halfedge_handle_).super_BaseHandle.idx_ = (int)_nheh.super_BaseHandle.idx_;
    }
    BVar4.idx_ = (int)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,_vh_00);
    if ((BaseHandle)BVar4.idx_ == HVar5.super_BaseHandle.idx_) {
      pVVar7 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh_00);
      (pVVar7->halfedge_handle_).super_BaseHandle.idx_ = (int)_nheh_00.super_BaseHandle.idx_;
    }
    BVar4.idx_ = (int)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,_fh.idx_);
    if (((BaseHandle)BVar4.idx_ == HVar5.super_BaseHandle.idx_) ||
       (HVar5 = ArrayKernel::halfedge_handle(&this->super_ArrayKernel,(FaceHandle)_fh.idx_),
       local_34 = _heh.super_BaseHandle.idx_,
       HVar5.super_BaseHandle.idx_ == (BaseHandle)_heh_01.idx_)) {
      pFVar8 = ArrayKernel::face(&this->super_ArrayKernel,(FaceHandle)_fh.idx_);
      (pFVar8->halfedge_handle_).super_BaseHandle.idx_ = local_34.idx_;
    }
    fh_iter((FaceHalfedgeIter *)local_70,this,(FaceHandle)_fh.idx_);
    while ((fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1 &&
           (((int)fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ !=
             fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ ||
            (fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
             idx_ == 0))))) {
      _heh_00 = Iterators::
                GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                ::operator*((FaceHalfedgeIter *)local_70);
      pHVar9 = ArrayKernel::halfedge
                         (&this->super_ArrayKernel,(HalfedgeHandle)_heh_00.super_BaseHandle.idx_);
      (pHVar9->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ = _fh.idx_;
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
      ::operator++((FaceHalfedgeIter *)local_70);
    }
    pSVar6 = ArrayKernel::status(&this->super_ArrayKernel,
                                 (BaseHandle)
                                 fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.
                                 lap_counter_);
    *(byte *)&pSVar6->status_ = (byte)pSVar6->status_ | 1;
    pSVar6 = ArrayKernel::status(&this->super_ArrayKernel,(FaceHandle)local_38.idx_);
    *(byte *)&pSVar6->status_ = (byte)pSVar6->status_ | 1;
    return (FaceHandle)(BaseHandle)_fh.idx_;
  }
  __assert_fail("!status(_eh).deleted() && is_simple_link(_eh)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                ,0x362,
                "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::remove_edge(EdgeHandle)");
}

Assistant:

PolyConnectivity::FaceHandle 
PolyConnectivity::remove_edge(EdgeHandle _eh)
{
  //don't allow "dangling" vertices and edges
  assert(!status(_eh).deleted() && is_simple_link(_eh));
  
  HalfedgeHandle heh0 = halfedge_handle(_eh, 0);
  HalfedgeHandle heh1 = halfedge_handle(_eh, 1);
  
  //deal with the faces
  FaceHandle rem_fh = face_handle(heh0), del_fh = face_handle(heh1);
  if (!del_fh.is_valid())
  {//boundary case - we must delete the rem_fh
    std::swap(del_fh, rem_fh);
  }
  assert(del_fh.is_valid());
/*  for (FaceHalfedgeIter fh_it = fh_iter(del_fh); fh_it; ++fh_it)
  {//set the face handle of the halfedges of del_fh to point to rem_fh
    set_face_handle(fh_it, rem_fh);  
  } */
  //fix the halfedge relations
  HalfedgeHandle prev_heh0 = prev_halfedge_handle(heh0);
  HalfedgeHandle prev_heh1 = prev_halfedge_handle(heh1);

  HalfedgeHandle next_heh0 = next_halfedge_handle(heh0);
  HalfedgeHandle next_heh1 = next_halfedge_handle(heh1);
  
  set_next_halfedge_handle(prev_heh0, next_heh1);
  set_next_halfedge_handle(prev_heh1, next_heh0);
  //correct outgoing vertex handles for the _eh vertices (if needed)
  VertexHandle vh0 = to_vertex_handle(heh0);
  VertexHandle vh1 = to_vertex_handle(heh1);
  
  if (halfedge_handle(vh0) == heh1)
  {
    set_halfedge_handle(vh0, next_heh0);
  }
  if (halfedge_handle(vh1) == heh0)
  {
    set_halfedge_handle(vh1, next_heh1);
  }
  
  //correct the hafledge handle of rem_fh if needed and preserve its first vertex
  if (halfedge_handle(rem_fh) == heh0)
  {//rem_fh is the face at heh0
    set_halfedge_handle(rem_fh, prev_heh1);
  }
  else if (halfedge_handle(rem_fh) == heh1)
  {//rem_fh is the face at heh1
    set_halfedge_handle(rem_fh, prev_heh0);
  }
  for (FaceHalfedgeIter fh_it = fh_iter(rem_fh); fh_it.is_valid(); ++fh_it)
  {//set the face handle of the halfedges of del_fh to point to rem_fh
    set_face_handle(*fh_it, rem_fh);
  } 
  
  status(_eh).set_deleted(true);  
  status(del_fh).set_deleted(true);  
  return rem_fh;//returns the remaining face handle
}